

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

void __thiscall r_exec::Group::inject(Group *this,View *view)

{
  const_iterator cVar1;
  undefined1 uVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  Code *pCVar6;
  undefined4 extraout_var;
  uint64_t ijt;
  mapped_type *pmVar7;
  Controller *pCVar8;
  P *pPVar9;
  View *pVVar10;
  AntiPGMController *this_00;
  _Mem *p_Var11;
  TimeJob *pTVar12;
  uint64_t uVar13;
  InputLessPGMController *this_01;
  undefined4 extraout_var_00;
  CSTController *this_02;
  ostream *poVar14;
  undefined4 extraout_var_01;
  Group *pGVar15;
  uint16_t index;
  uint16_t index_00;
  P<r_exec::View> local_1c0;
  _Self local_1b8;
  _Base_ptr local_1b0;
  _Rb_tree_const_iterator<core::P<r_exec::View>_> local_1a8;
  const_iterator v_5;
  MDLController *c_5;
  uint64_t uStack_190;
  bool inject_in_secondary_group;
  string local_188 [32];
  _Self local_168;
  _Base_ptr local_160;
  _Rb_tree_const_iterator<core::P<r_exec::View>_> local_158;
  const_iterator v_4;
  CSTController *c_4;
  string local_140 [32];
  uint64_t local_120;
  uint64_t local_118;
  InputLessPGMController *local_110;
  InputLessPGMController *c_3;
  _Self local_100;
  _Base_ptr local_f8;
  _Rb_tree_const_iterator<core::P<r_exec::View>_> local_f0;
  const_iterator v_3;
  AntiPGMController *c_2;
  _Self local_d8;
  _Base_ptr local_d0;
  _Rb_tree_const_iterator<core::P<r_exec::View>_> local_c8;
  const_iterator v_2;
  Controller *c_1;
  string str;
  uint64_t local_90;
  _Self local_88;
  _Base_ptr local_80;
  _Rb_tree_const_iterator<core::P<r_exec::View>_> local_78;
  const_iterator v_1;
  PGMController *c;
  _Self local_60;
  _Base_ptr local_58;
  _Rb_tree_const_iterator<core::P<r_exec::View>_> local_50;
  const_iterator v;
  uint64_t now;
  undefined4 local_24;
  Atom a;
  lock_guard<std::mutex> guard;
  View *view_local;
  Group *this_local;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffe0,&this->mutex);
  pCVar6 = core::P<r_code::Code>::operator->(&(view->super_View).object);
  iVar5 = (*(pCVar6->super__Object)._vptr__Object[4])(pCVar6,0);
  local_24 = *(undefined4 *)CONCAT44(extraout_var,iVar5);
  ijt = (*Now)();
  r_code::View::set_ijt(&view->super_View,ijt);
  uVar2 = r_code::Atom::getDescriptor();
  switch(uVar2) {
  case 0xc3:
    local_120 = View::get_oid(view);
    pmVar7 = std::
             unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
             ::operator[](&this->other_views,&local_120);
    core::P<r_exec::View>::operator=(pmVar7,view);
    cov(this,view);
    break;
  case 0xc4:
    local_118 = View::get_oid(view);
    pmVar7 = std::
             unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
             ::operator[](&this->other_views,&local_118);
    core::P<r_exec::View>::operator=(pmVar7,view);
    cov(this,view);
    break;
  case 0xc9:
    c = (PGMController *)View::get_oid(view);
    pmVar7 = std::
             unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
             ::operator[](&this->ipgm_views,(key_type *)&c);
    core::P<r_exec::View>::operator=(pmVar7,view);
    pCVar8 = (Controller *)operator_new(0xa0);
    PGMController::PGMController((PGMController *)pCVar8,&view->super_View);
    v_1._M_node = (_Base_ptr)pCVar8;
    core::P<r_exec::Controller>::operator=(&view->controller,pCVar8);
    bVar4 = is_active_pgm(this,view);
    if (bVar4) {
      (**(code **)(*(long *)v_1._M_node + 0x28))();
      std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::_Rb_tree_const_iterator(&local_78);
      local_80 = (_Base_ptr)
                 std::
                 multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
                 ::begin(&this->newly_salient_views);
      local_78._M_node = local_80;
      while( true ) {
        local_88._M_node =
             (_Base_ptr)
             std::
             multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
             ::end(&this->newly_salient_views);
        bVar4 = std::operator!=(&local_78,&local_88);
        cVar1 = v_1;
        if (!bVar4) break;
        pPVar9 = (P *)std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::operator*(&local_78);
        pVVar10 = core::P::operator_cast_to_View_(pPVar9);
        Controller::_take_input((Controller *)cVar1._M_node,pVVar10);
        std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::operator++(&local_78);
      }
    }
    break;
  case 0xca:
    local_90 = View::get_oid(view);
    pmVar7 = std::
             unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
             ::operator[](&this->ipgm_views,&local_90);
    core::P<r_exec::View>::operator=(pmVar7,view);
    pCVar6 = core::P::operator_cast_to_Code_((P *)&(view->super_View).object);
    r_code::Utils::GetString<r_code::Code>((Utils *)&c_1,pCVar6,1);
    pCVar8 = CPPPrograms::New((string *)&c_1,&view->super_View);
    if (pCVar8 == (Controller *)0x0) {
      v_2._M_node._4_4_ = 1;
    }
    else {
      core::P<r_exec::Controller>::operator=(&view->controller,pCVar8);
      bVar4 = is_active_pgm(this,view);
      if (bVar4) {
        (*(pCVar8->super__Object)._vptr__Object[5])();
        std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::_Rb_tree_const_iterator(&local_c8);
        local_d0 = (_Base_ptr)
                   std::
                   multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
                   ::begin(&this->newly_salient_views);
        local_c8._M_node = local_d0;
        while( true ) {
          local_d8._M_node =
               (_Base_ptr)
               std::
               multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
               ::end(&this->newly_salient_views);
          bVar4 = std::operator!=(&local_c8,&local_d8);
          if (!bVar4) break;
          pPVar9 = (P *)std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::operator*(&local_c8);
          pVVar10 = core::P::operator_cast_to_View_(pPVar9);
          Controller::_take_input(pCVar8,pVVar10);
          std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::operator++(&local_c8);
        }
      }
      v_2._M_node._4_4_ = 2;
    }
    std::__cxx11::string::~string((string *)&c_1);
    if (v_2._M_node._4_4_ != 2) goto LAB_0023c94d;
    break;
  case 0xcb:
    c_3 = (InputLessPGMController *)View::get_oid(view);
    pmVar7 = std::
             unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
             ::operator[](&this->input_less_ipgm_views,(key_type *)&c_3);
    core::P<r_exec::View>::operator=(pmVar7,view);
    this_01 = (InputLessPGMController *)operator_new(200);
    InputLessPGMController::InputLessPGMController(this_01,&view->super_View);
    local_110 = this_01;
    core::P<r_exec::Controller>::operator=(&view->controller,(Controller *)this_01);
    bVar4 = is_active_pgm(this,view);
    if (bVar4) {
      (*(local_110->super__PGMController).super_OController.super_Controller.super__Object.
        _vptr__Object[5])();
      p_Var11 = _Mem::Get();
      pTVar12 = (TimeJob *)operator_new(0x28);
      pCVar6 = core::P::operator_cast_to_Code_((P *)&(view->super_View).object);
      uVar13 = r_code::Utils::GetTimestamp<r_code::Code>((Utils *)pCVar6,(Code *)0x4,index_00);
      InputLessPGMSignalingJob::InputLessPGMSignalingJob
                ((InputLessPGMSignalingJob *)pTVar12,view,ijt + uVar13);
      _Mem::pushTimeJob(p_Var11,pTVar12);
    }
    break;
  case 0xcc:
    c_2 = (AntiPGMController *)View::get_oid(view);
    pmVar7 = std::
             unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
             ::operator[](&this->anti_ipgm_views,(key_type *)&c_2);
    core::P<r_exec::View>::operator=(pmVar7,view);
    this_00 = (AntiPGMController *)operator_new(200);
    AntiPGMController::AntiPGMController(this_00,&view->super_View);
    v_3._M_node = (_Base_ptr)this_00;
    core::P<r_exec::Controller>::operator=(&view->controller,(Controller *)this_00);
    bVar4 = is_active_pgm(this,view);
    if (bVar4) {
      (**(code **)(*(long *)v_3._M_node + 0x28))();
      std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::_Rb_tree_const_iterator(&local_f0);
      local_f8 = (_Base_ptr)
                 std::
                 multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
                 ::begin(&this->newly_salient_views);
      local_f0._M_node = local_f8;
      while( true ) {
        local_100._M_node =
             (_Base_ptr)
             std::
             multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
             ::end(&this->newly_salient_views);
        bVar4 = std::operator!=(&local_f0,&local_100);
        cVar1 = v_3;
        if (!bVar4) break;
        pPVar9 = (P *)std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::operator*(&local_f0);
        pVVar10 = core::P::operator_cast_to_View_(pPVar9);
        Controller::_take_input((Controller *)cVar1._M_node,pVVar10);
        std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::operator++(&local_f0);
      }
      p_Var11 = _Mem::Get();
      pTVar12 = (TimeJob *)operator_new(0x28);
      pCVar6 = Controller::getObject((Controller *)v_3._M_node);
      uVar13 = r_code::Utils::GetTimestamp<r_code::Code>((Utils *)pCVar6,(Code *)0x4,index);
      AntiPGMSignalingJob::AntiPGMSignalingJob((AntiPGMSignalingJob *)pTVar12,view,ijt + uVar13);
      _Mem::pushTimeJob(p_Var11,pTVar12);
    }
    break;
  case 0xcd:
    poVar14 = _Mem::Output(HLP_INJ);
    (*Now)();
    r_code::Utils::RelativeTime_abi_cxx11_((ulong)local_140);
    poVar14 = std::operator<<(poVar14,local_140);
    poVar14 = std::operator<<(poVar14," cst ");
    pCVar6 = core::P<r_code::Code>::operator->(&(view->super_View).object);
    iVar5 = (*(pCVar6->super__Object)._vptr__Object[2])();
    poVar14 = (ostream *)std::ostream::operator<<(poVar14,CONCAT44(extraout_var_00,iVar5));
    poVar14 = std::operator<<(poVar14," injected");
    std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_140);
    c_4 = (CSTController *)View::get_oid(view);
    pmVar7 = std::
             unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
             ::operator[](&this->ipgm_views,(key_type *)&c_4);
    core::P<r_exec::View>::operator=(pmVar7,view);
    this_02 = (CSTController *)operator_new(0x1e8);
    CSTController::CSTController(this_02,&view->super_View);
    v_4._M_node = (_Base_ptr)this_02;
    core::P<r_exec::Controller>::operator=(&view->controller,(Controller *)this_02);
    cVar1._M_node = v_4._M_node;
    pGVar15 = get_secondary_group(this);
    CSTController::set_secondary_host((CSTController *)cVar1._M_node,pGVar15);
    bVar4 = is_active_pgm(this,view);
    if (bVar4) {
      (**(code **)(*(long *)v_4._M_node + 0x28))();
      std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::_Rb_tree_const_iterator(&local_158);
      local_160 = (_Base_ptr)
                  std::
                  multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
                  ::begin(&this->newly_salient_views);
      local_158._M_node = local_160;
      while( true ) {
        local_168._M_node =
             (_Base_ptr)
             std::
             multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
             ::end(&this->newly_salient_views);
        bVar4 = std::operator!=(&local_158,&local_168);
        cVar1 = v_4;
        if (!bVar4) break;
        pPVar9 = (P *)std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::operator*(&local_158);
        pVVar10 = core::P::operator_cast_to_View_(pPVar9);
        Controller::_take_input((Controller *)cVar1._M_node,pVVar10);
        std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::operator++(&local_158);
      }
    }
    break;
  case 0xce:
    poVar14 = _Mem::Output(HLP_INJ);
    (*Now)();
    r_code::Utils::RelativeTime_abi_cxx11_((ulong)local_188);
    poVar14 = std::operator<<(poVar14,local_188);
    poVar14 = std::operator<<(poVar14," mdl ");
    pCVar6 = core::P<r_code::Code>::operator->(&(view->super_View).object);
    iVar5 = (*(pCVar6->super__Object)._vptr__Object[2])();
    poVar14 = (ostream *)std::ostream::operator<<(poVar14,CONCAT44(extraout_var_01,iVar5));
    poVar14 = std::operator<<(poVar14," injected");
    std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_188);
    uStack_190 = View::get_oid(view);
    pmVar7 = std::
             unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
             ::operator[](&this->ipgm_views,&stack0xfffffffffffffe70);
    core::P<r_exec::View>::operator=(pmVar7,view);
    v_5._M_node = (_Base_ptr)MDLController::New(view,(bool *)((long)&c_5 + 7));
    core::P<r_exec::Controller>::operator=(&view->controller,(Controller *)v_5._M_node);
    if ((c_5._7_1_ & 1) != 0) {
      pGVar15 = get_secondary_group(this);
      inject_secondary_mdl_controller(pGVar15,view);
    }
    bVar4 = is_active_pgm(this,view);
    if (bVar4) {
      (**(code **)(*(long *)v_5._M_node + 0x28))();
      std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::_Rb_tree_const_iterator(&local_1a8);
      local_1b0 = (_Base_ptr)
                  std::
                  multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
                  ::begin(&this->newly_salient_views);
      local_1a8._M_node = local_1b0;
      while( true ) {
        local_1b8._M_node =
             (_Base_ptr)
             std::
             multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
             ::end(&this->newly_salient_views);
        bVar4 = std::operator!=(&local_1a8,&local_1b8);
        cVar1 = v_5;
        if (!bVar4) break;
        pPVar9 = (P *)std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::operator*(&local_1a8);
        pVVar10 = core::P::operator_cast_to_View_(pPVar9);
        Controller::_take_input((Controller *)cVar1._M_node,pVVar10);
        std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::operator++(&local_1a8);
      }
    }
    break;
  case 0xcf:
    v._M_node = (_Base_ptr)View::get_oid(view);
    pmVar7 = std::
             unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
             ::operator[](&this->ipgm_views,(key_type *)&v);
    core::P<r_exec::View>::operator=(pmVar7,view);
    bVar4 = is_active_pgm(this,view);
    if (bVar4) {
      pCVar8 = core::P<r_exec::Controller>::operator->(&view->controller);
      (*(pCVar8->super__Object)._vptr__Object[5])();
      bVar3 = r_code::Atom::takesPastInputs();
      if ((bVar3 & 1) != 0) {
        std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::_Rb_tree_const_iterator(&local_50);
        local_58 = (_Base_ptr)
                   std::
                   multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
                   ::begin(&this->newly_salient_views);
        local_50._M_node = local_58;
        while( true ) {
          local_60._M_node =
               (_Base_ptr)
               std::
               multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
               ::end(&this->newly_salient_views);
          bVar4 = std::operator!=(&local_50,&local_60);
          if (!bVar4) break;
          pCVar8 = core::P<r_exec::Controller>::operator->(&view->controller);
          pPVar9 = (P *)std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::operator*(&local_50);
          pVVar10 = core::P::operator_cast_to_View_(pPVar9);
          Controller::_take_input(pCVar8,pVVar10);
          std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::operator++(&local_50);
        }
      }
    }
  }
  bVar4 = is_eligible_input(this,view);
  if (bVar4) {
    core::P<r_exec::View>::P(&local_1c0,view);
    std::
    multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>::
    insert(&this->newly_salient_views,&local_1c0);
    core::P<r_exec::View>::~P(&local_1c0);
    inject_reduction_jobs(this,view);
  }
  v_2._M_node._4_4_ = 0;
LAB_0023c94d:
  r_code::Atom::~Atom((Atom *)&local_24);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void Group::inject(View *view)
{
    std::lock_guard<std::mutex> guard(mutex);
    Atom a = view->object->code(0);
    uint64_t now = Now();
    view->set_ijt(now);

    switch (a.getDescriptor()) {
    case Atom::NULL_PROGRAM: // the view comes with a controller.
        ipgm_views[view->get_oid()] = view;

        if (is_active_pgm(view)) {
            view->controller->gain_activation();

            if (a.takesPastInputs()) {
                std::multiset<P<View>, r_code::View::Less>::const_iterator v;

                for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) {
                    view->controller->_take_input(*v);    // view will be copied.
                }
            }
        }

        break;

    case Atom::INSTANTIATED_PROGRAM: {
        ipgm_views[view->get_oid()] = view;
        PGMController *c = new PGMController(view);
        view->controller = c;

        if (is_active_pgm(view)) {
            c->gain_activation();
            std::multiset<P<View>, r_code::View::Less>::const_iterator v;

            for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) {
                c->_take_input(*v);    // view will be copied.
            }
        }

        break;
    }

    case Atom::INSTANTIATED_CPP_PROGRAM: {
        ipgm_views[view->get_oid()] = view;
        std::string str = Utils::GetString<Code>(view->object, ICPP_PGM_NAME);
        Controller *c = CPPPrograms::New(str, view);

        if (!c) {
            return;
        }

        view->controller = c;

        if (is_active_pgm(view)) {
            c->gain_activation();
            std::multiset<P<View>, r_code::View::Less>::const_iterator v;

            for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) {
                c->_take_input(*v);    // view will be copied.
            }
        }

        break;
    }

    case Atom::INSTANTIATED_ANTI_PROGRAM: {
        anti_ipgm_views[view->get_oid()] = view;
        AntiPGMController *c = new AntiPGMController(view);
        view->controller = c;

        if (is_active_pgm(view)) {
            c->gain_activation();
            std::multiset<P<View>, r_code::View::Less>::const_iterator v;

            for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) {
                c->_take_input(*v);    // view will be copied.
            }

            _Mem::Get()->pushTimeJob(new AntiPGMSignalingJob(view, now + Utils::GetTimestamp<Code>(c->getObject(), IPGM_TSC)));
        }

        break;
    }

    case Atom::INSTANTIATED_INPUT_LESS_PROGRAM: {
        input_less_ipgm_views[view->get_oid()] = view;
        InputLessPGMController *c = new InputLessPGMController(view);
        view->controller = c;

        if (is_active_pgm(view)) {
            c->gain_activation();
            _Mem::Get()->pushTimeJob(new InputLessPGMSignalingJob(view, now + Utils::GetTimestamp<Code>(view->object, IPGM_TSC)));
        }

        break;
    }

    case Atom::MARKER: // the marker has already been added to the mks of its references.
        other_views[view->get_oid()] = view;
        cov(view);
        break;

    case Atom::OBJECT:
        other_views[view->get_oid()] = view;
        cov(view);
        break;

    case Atom::COMPOSITE_STATE: {
        OUTPUT(HLP_INJ) << Utils::RelativeTime(Now()) << " cst " << view->object->get_oid() << " injected" << std::endl;
        ipgm_views[view->get_oid()] = view;
        CSTController *c = new CSTController(view);
        view->controller = c;
        c->set_secondary_host(get_secondary_group());

        if (is_active_pgm(view)) {
            c->gain_activation();
            std::multiset<P<View>, r_code::View::Less>::const_iterator v;

            for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) {
                c->_take_input(*v);    // view will be copied.
            }
        }

        break;
    }

    case Atom::MODEL: {
        OUTPUT(HLP_INJ) << Utils::RelativeTime(Now()) << " mdl " << view->object->get_oid() << " injected" << std::endl;
        ipgm_views[view->get_oid()] = view;
        bool inject_in_secondary_group;
        MDLController *c = MDLController::New(view, inject_in_secondary_group);
        view->controller = c;

        if (inject_in_secondary_group) {
            get_secondary_group()->inject_secondary_mdl_controller(view);
        }

        if (is_active_pgm(view)) {
            c->gain_activation();
            std::multiset<P<View>, r_code::View::Less>::const_iterator v;

            for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) {
                c->Controller::_take_input(*v);    // view will be copied.
            }
        }

        break;
    }
    }

    if (is_eligible_input(view)) { // have existing programs reduce the new view.
        newly_salient_views.insert(view);
        inject_reduction_jobs(view);
    }

    //if(get_oid()==2)
    // std::cout<<Utils::RelativeTime(Now())<<" stdin <- "<<view->object->get_oid()<<std::endl;
}